

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

AutoFile * __thiscall
AutoFile::operator<<(AutoFile *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *obj)

{
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  AutoFile *os;
  
  os = *(AutoFile **)(in_FS_OFFSET + 0x28);
  Serialize<AutoFile,unsigned_char,std::allocator<unsigned_char>>
            (os,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(AutoFile **)(in_FS_OFFSET + 0x28) == os) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return *this;
    }